

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

bool ASCIICharToWide(char *sASCII,size_t sASCII_length,wchar_t *wASCII,size_t wASCII_capacity)

{
  char cVar1;
  wchar_t *pwVar2;
  
  if ((sASCII != (char *)0x0) && ((wchar_t *)0x3f < wASCII && sASCII_length != 0)) {
    pwVar2 = (wchar_t *)0x0;
    do {
      cVar1 = sASCII[(long)pwVar2];
      if (cVar1 < '\0') {
        if (pwVar2 < (wchar_t *)0x40) goto LAB_004cd359;
        goto LAB_004cd33a;
      }
      if (cVar1 == '\0') {
        *(undefined4 *)(sASCII_length + (long)pwVar2 * 4) = 0;
        pwVar2 = (wchar_t *)((long)pwVar2 + 1);
        goto LAB_004cd33a;
      }
      *(int *)(sASCII_length + (long)pwVar2 * 4) = (int)cVar1;
      pwVar2 = (wchar_t *)((long)pwVar2 + 1);
    } while (pwVar2 != (wchar_t *)0x40);
    pwVar2 = (wchar_t *)0x40;
LAB_004cd33a:
    if (pwVar2 <= wASCII && (long)wASCII - (long)pwVar2 != 0) {
      memset((void *)(sASCII_length + (long)pwVar2 * 4),0,((long)wASCII - (long)pwVar2) * 4);
    }
    if (*(int *)((sASCII_length - 4) + (long)wASCII * 4) == 0) {
      return true;
    }
  }
LAB_004cd359:
  if (wASCII != (wchar_t *)0x0 && sASCII_length != 0) {
    memset((void *)sASCII_length,0,(long)wASCII << 2);
  }
  return false;
}

Assistant:

static bool ASCIICharToWide(
  const char* sASCII,
  size_t sASCII_length,
  wchar_t* wASCII,
  size_t wASCII_capacity
  )
{
  for (;;)
  {
    if (nullptr == sASCII || sASCII_length <= 0)
      break;
    if (nullptr == wASCII || wASCII_capacity <= 0)
      break;
    if (wASCII_capacity < sASCII_length)
      break;

    size_t i;
    for (i = 0; i < sASCII_length; i++)
    {
      const char c = sASCII[i];
      if (c < 0 || c > 127)
        break;
      if (0 == c)
      {
        wASCII[i++] = 0;
        sASCII_length = i;
        break;
      }

      wASCII[i] = (wchar_t)c;
    }
    if ( i < sASCII_length )
      break;

    for(/*empty init*/;i < wASCII_capacity; i++)
      wASCII[i] = 0;

    if ( 0 != wASCII[wASCII_capacity-1])
      break;
    return true;
  }

  if ( nullptr != wASCII && wASCII_capacity > 0)
    memset(wASCII,0,wASCII_capacity*sizeof(wASCII[0]));

  return false;
}